

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_perform_ehlo(connectdata *conn)

{
  CURLcode CVar1;
  
  *(undefined4 *)((long)&conn->proto + 0xac) = 0;
  (conn->proto).ftpc.cwdcount = 0;
  (conn->proto).imapc.resptag[0] = '\0';
  (conn->proto).imapc.resptag[3] = '\0';
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"EHLO %s",(conn->proto).ftpc.dirs);
  if (CVar1 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_CAPABILITY;
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_ehlo(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  smtpc->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanism yet */
  smtpc->sasl.authused = SASL_AUTH_NONE;  /* Clear the authentication mechanism
                                             used for esmtp connections */
  smtpc->tls_supported = FALSE;           /* Clear the TLS capability */
  smtpc->auth_supported = FALSE;          /* Clear the AUTH capability */

  /* Send the EHLO command */
  result = Curl_pp_sendf(&smtpc->pp, "EHLO %s", smtpc->domain);

  if(!result)
    state(conn, SMTP_EHLO);

  return result;
}